

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O2

void google::protobuf::TestUtilLite::SetAllFields(TestAllTypesLite *message)

{
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<int> *this_03;
  RepeatedField<long> *this_04;
  byte *pbVar1;
  RepeatedField<unsigned_int> *this_05;
  RepeatedField<unsigned_long> *this_06;
  RepeatedField<int> *this_07;
  RepeatedField<long> *this_08;
  RepeatedField<float> *this_09;
  RepeatedField<double> *this_10;
  RepeatedField<bool> *this_11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dest;
  undefined1 *puVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *this_12;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *this_13;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *this_14;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *this_15;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *this_16;
  OneofFieldUnion *this_17;
  TestAllTypesLite_OptionalGroup *pTVar3;
  TestAllTypesLite_NestedMessage *pTVar4;
  ForeignMessageLite *pFVar5;
  ImportMessageLite *pIVar6;
  PublicImportMessageLite *pPVar7;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>_>
  *pVVar8;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>_>
  *pVVar9;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>_>
  *pVVar10;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>_>
  *pVVar11;
  Arena *pAVar12;
  
  *(undefined8 *)((long)&message->field_0 + 0x248) = 0x6700000065;
  (message->field_0)._impl_.optional_int64_ = 0x66;
  (message->field_0)._impl_.optional_uint64_ = 0x68;
  *(undefined8 *)((long)&message->field_0 + 0x260) = 0x6b00000069;
  (message->field_0)._impl_.optional_sint64_ = 0x6a;
  (message->field_0)._impl_.optional_fixed64_ = 0x6c;
  *(undefined8 *)((long)&message->field_0 + 0x278) = 0x42de00000000006d;
  (message->field_0)._impl_.optional_sfixed64_ = 0x6e;
  (message->field_0)._impl_.optional_double_ = 112.0;
  (message->field_0)._impl_.optional_bool_ = true;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0xfff801;
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_string_,"115",pAVar12);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_bytes_,"116",pAVar12);
  pTVar3 = proto2_unittest::TestAllTypesLite::mutable_optionalgroup(message);
  (pTVar3->field_0)._impl_.a_ = 0x75;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 1;
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_nested_message(message);
  (pTVar4->field_0)._impl_.bb_ = 0x76;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 2;
  pFVar5 = proto2_unittest::TestAllTypesLite::mutable_optional_foreign_message(message);
  (pFVar5->field_0)._impl_.c_ = 0x77;
  *(byte *)&pFVar5->field_0 = *(byte *)&pFVar5->field_0 | 1;
  pIVar6 = proto2_unittest::TestAllTypesLite::mutable_optional_import_message(message);
  (pIVar6->field_0)._impl_.d_ = 0x78;
  *(byte *)&pIVar6->field_0 = *(byte *)&pIVar6->field_0 | 1;
  pPVar7 = proto2_unittest::TestAllTypesLite::mutable_optional_public_import_message(message);
  (pPVar7->field_0)._impl_.e_ = 0x7e;
  *(byte *)&pPVar7->field_0 = *(byte *)&pPVar7->field_0 | 1;
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_lazy_message(message);
  (pTVar4->field_0)._impl_.bb_ = 0x7f;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 2;
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_unverified_lazy_message(message);
  (pTVar4->field_0)._impl_.bb_ = 0x80;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 2;
  proto2_unittest::TestAllTypesLite::set_optional_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAZ);
  proto2_unittest::TestAllTypesLite::set_optional_foreign_enum(message,FOREIGN_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::set_optional_import_enum(message,IMPORT_LITE_BAZ);
  this = &(message->field_0)._impl_.repeated_int32_;
  RepeatedField<int>::Add(this,0xc9);
  this_00 = &(message->field_0)._impl_.repeated_int64_;
  RepeatedField<long>::Add(this_00,0xca);
  this_01 = &(message->field_0)._impl_.repeated_uint32_;
  RepeatedField<unsigned_int>::Add(this_01,0xcb);
  this_02 = &(message->field_0)._impl_.repeated_uint64_;
  RepeatedField<unsigned_long>::Add(this_02,0xcc);
  this_03 = &(message->field_0)._impl_.repeated_sint32_;
  RepeatedField<int>::Add(this_03,0xcd);
  this_04 = &(message->field_0)._impl_.repeated_sint64_;
  RepeatedField<long>::Add(this_04,0xce);
  this_05 = &(message->field_0)._impl_.repeated_fixed32_;
  RepeatedField<unsigned_int>::Add(this_05,0xcf);
  this_06 = &(message->field_0)._impl_.repeated_fixed64_;
  RepeatedField<unsigned_long>::Add(this_06,0xd0);
  this_07 = &(message->field_0)._impl_.repeated_sfixed32_;
  RepeatedField<int>::Add(this_07,0xd1);
  this_08 = &(message->field_0)._impl_.repeated_sfixed64_;
  RepeatedField<long>::Add(this_08,0xd2);
  this_09 = &(message->field_0)._impl_.repeated_float_;
  RepeatedField<float>::Add(this_09,211.0);
  this_10 = &(message->field_0)._impl_.repeated_double_;
  RepeatedField<double>::Add(this_10,212.0);
  this_11 = &(message->field_0)._impl_.repeated_bool_;
  RepeatedField<bool>::Add(this_11,true);
  dest = &(message->field_0)._impl_.repeated_string_;
  internal::AddToRepeatedPtrField<char_const(&)[4]>(dest,(char (*) [4])"215");
  puVar2 = (undefined1 *)((long)&message->field_0 + 0xf8);
  internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            (puVar2,"216");
  this_12 = &(message->field_0)._impl_.repeatedgroup_;
  pVVar8 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>>
                     (&this_12->super_RepeatedPtrFieldBase);
  (pVVar8->field_0)._impl_.a_ = 0xd9;
  *(byte *)&pVVar8->field_0 = *(byte *)&pVVar8->field_0 | 1;
  this_13 = &(message->field_0)._impl_.repeated_nested_message_;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                     (&this_13->super_RepeatedPtrFieldBase);
  (pVVar9->field_0)._impl_.bb_ = 0xda;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 2;
  this_14 = &(message->field_0)._impl_.repeated_foreign_message_;
  pVVar10 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>>
                      (&this_14->super_RepeatedPtrFieldBase);
  (pVVar10->field_0)._impl_.c_ = 0xdb;
  *(byte *)&pVVar10->field_0 = *(byte *)&pVVar10->field_0 | 1;
  this_15 = &(message->field_0)._impl_.repeated_import_message_;
  pVVar11 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
                      (&this_15->super_RepeatedPtrFieldBase);
  (pVVar11->field_0)._impl_.d_ = 0xdc;
  *(byte *)&pVVar11->field_0 = *(byte *)&pVVar11->field_0 | 1;
  this_16 = &(message->field_0)._impl_.repeated_lazy_message_;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                     (&this_16->super_RepeatedPtrFieldBase);
  (pVVar9->field_0)._impl_.bb_ = 0xe3;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 2;
  proto2_unittest::TestAllTypesLite::add_repeated_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAR);
  proto2_unittest::TestAllTypesLite::add_repeated_foreign_enum(message,FOREIGN_LITE_BAR);
  proto2_unittest::TestAllTypesLite::add_repeated_import_enum(message,IMPORT_LITE_BAR);
  RepeatedField<int>::Add(this,0x12d);
  RepeatedField<long>::Add(this_00,0x12e);
  RepeatedField<unsigned_int>::Add(this_01,0x12f);
  RepeatedField<unsigned_long>::Add(this_02,0x130);
  RepeatedField<int>::Add(this_03,0x131);
  RepeatedField<long>::Add(this_04,0x132);
  RepeatedField<unsigned_int>::Add(this_05,0x133);
  RepeatedField<unsigned_long>::Add(this_06,0x134);
  RepeatedField<int>::Add(this_07,0x135);
  RepeatedField<long>::Add(this_08,0x136);
  RepeatedField<float>::Add(this_09,311.0);
  RepeatedField<double>::Add(this_10,312.0);
  RepeatedField<bool>::Add(this_11,false);
  internal::AddToRepeatedPtrField<char_const(&)[4]>(dest,(char (*) [4])"315");
  internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            (puVar2,"316");
  pVVar8 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_RepeatedGroup>>
                     (&this_12->super_RepeatedPtrFieldBase);
  (pVVar8->field_0)._impl_.a_ = 0x13d;
  *(byte *)&pVVar8->field_0 = *(byte *)&pVVar8->field_0 | 1;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                     (&this_13->super_RepeatedPtrFieldBase);
  (pVVar9->field_0)._impl_.bb_ = 0x13e;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 2;
  pVVar10 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessageLite>>
                      (&this_14->super_RepeatedPtrFieldBase);
  (pVVar10->field_0)._impl_.c_ = 0x13f;
  *(byte *)&pVVar10->field_0 = *(byte *)&pVVar10->field_0 | 1;
  pVVar11 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessageLite>>
                      (&this_15->super_RepeatedPtrFieldBase);
  (pVVar11->field_0)._impl_.d_ = 0x140;
  *(byte *)&pVVar11->field_0 = *(byte *)&pVVar11->field_0 | 1;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite_NestedMessage>>
                     (&this_16->super_RepeatedPtrFieldBase);
  (pVVar9->field_0)._impl_.bb_ = 0x147;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 2;
  proto2_unittest::TestAllTypesLite::add_repeated_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAZ);
  proto2_unittest::TestAllTypesLite::add_repeated_foreign_enum(message,FOREIGN_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::add_repeated_import_enum(message,IMPORT_LITE_BAZ);
  *(undefined8 *)((long)&message->field_0 + 0x2d8) = 0x19300000191;
  (message->field_0)._impl_.default_int64_ = 0x192;
  (message->field_0)._impl_.default_uint64_ = 0x194;
  *(undefined8 *)((long)&message->field_0 + 0x2f0) = 0x19700000195;
  (message->field_0)._impl_.default_sint64_ = 0x196;
  (message->field_0)._impl_.default_fixed64_ = 0x198;
  *(undefined8 *)((long)&message->field_0 + 0x308) = 0x43cd800000000199;
  (message->field_0)._impl_.default_sfixed64_ = 0x19a;
  (message->field_0)._impl_.default_double_ = 412.0;
  (message->field_0)._impl_.default_bool_ = false;
  *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ =
       *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ | 0x3ffe08000000;
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_string_,"415",pAVar12);
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 0x10;
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_bytes_,"416",pAVar12);
  proto2_unittest::TestAllTypesLite::set_default_nested_enum
            (message,TestAllTypesLite_NestedEnum_FOO);
  proto2_unittest::TestAllTypesLite::set_default_foreign_enum(message,FOREIGN_LITE_FOO);
  proto2_unittest::TestAllTypesLite::set_default_import_enum(message,IMPORT_LITE_FOO);
  proto2_unittest::TestAllTypesLite::set_oneof_uint32(message,0x259);
  pTVar4 = proto2_unittest::TestAllTypesLite::_internal_mutable_oneof_nested_message(message);
  (pTVar4->field_0)._impl_.bb_ = 0x25a;
  *(byte *)&pTVar4->field_0 = *(byte *)&pTVar4->field_0 | 2;
  if ((message->field_0)._impl_._oneof_case_[0] != 0x71) {
    proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x71;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (MessageLite *)&internal::fixed_address_empty_string;
  }
  this_17 = &(message->field_0)._impl_.oneof_field_;
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&this_17->oneof_string_,"603",pAVar12);
  if ((message->field_0)._impl_._oneof_case_[0] != 0x72) {
    proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x72;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (MessageLite *)&internal::fixed_address_empty_string;
  }
  pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&this_17->oneof_string_,"604",pAVar12);
  return;
}

Assistant:

void TestUtilLite::SetAllFields(unittest::TestAllTypesLite* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->set_optional_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->set_optional_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->add_repeated_int32(201);
  message->add_repeated_int64(202);
  message->add_repeated_uint32(203);
  message->add_repeated_uint64(204);
  message->add_repeated_sint32(205);
  message->add_repeated_sint64(206);
  message->add_repeated_fixed32(207);
  message->add_repeated_fixed64(208);
  message->add_repeated_sfixed32(209);
  message->add_repeated_sfixed64(210);
  message->add_repeated_float(211);
  message->add_repeated_double(212);
  message->add_repeated_bool(true);
  message->add_repeated_string("215");
  message->add_repeated_bytes("216");

  message->add_repeatedgroup()->set_a(217);
  message->add_repeated_nested_message()->set_bb(218);
  message->add_repeated_foreign_message()->set_c(219);
  message->add_repeated_import_message()->set_d(220);
  message->add_repeated_lazy_message()->set_bb(227);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAR);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAR);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAR);


  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(unittest::TestAllTypesLite::FOO);
  message->set_default_foreign_enum(unittest::FOREIGN_LITE_FOO);
  message->set_default_import_enum(unittest_import::IMPORT_LITE_FOO);


  message->set_oneof_uint32(601);
  message->mutable_oneof_nested_message()->set_bb(602);
  message->set_oneof_string("603");
  message->set_oneof_bytes("604");
}